

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.hpp
# Opt level: O1

PixelBufferAccess * __thiscall
tcu::TextureLevel::getAccess(PixelBufferAccess *__return_storage_ptr__,TextureLevel *this)

{
  tcu local_2c [12];
  
  if ((this->m_size).m_data[1] * (this->m_size).m_data[0] * (this->m_size).m_data[2] == 0) {
    ConstPixelBufferAccess::ConstPixelBufferAccess
              (&__return_storage_ptr__->super_ConstPixelBufferAccess);
  }
  else {
    calculatePackedPitch(local_2c,&this->m_format,&this->m_size);
    PixelBufferAccess::PixelBufferAccess
              (__return_storage_ptr__,&this->m_format,&this->m_size,(IVec3 *)local_2c,
               (this->m_data).m_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

TextureFormat (ChannelOrder order_, ChannelType type_)
		: order	(order_)
		, type	(type_)
	{
	}